

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chain_matrix.h
# Opt level: O2

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
Gudhi::persistence_matrix::
Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,false,false,true>>>
::insert_boundary<std::vector<unsigned_int,std::allocator<unsigned_int>>>
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,false,false,true>>>
          *this,ID_index cellID,vector<unsigned_int,_std::allocator<unsigned_int>_> *boundary,
          Dimension dim)

{
  Dimension DVar1;
  undefined8 in_RAX;
  long lVar2;
  ulong uVar3;
  undefined8 local_38;
  
  uVar3 = (ulong)cellID;
  local_38 = in_RAX;
  if ((ulong)(*(long *)(this + 0xf0) - *(long *)(this + 0xe8) >> 2) <= uVar3) {
    local_38 = CONCAT44(0xffffffff,(value_type_conflict1)in_RAX);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(this + 0xe8),
               (ulong)(cellID * 2 + 1),(value_type_conflict1 *)((long)&local_38 + 4));
  }
  lVar2 = *(long *)(this + 0x40);
  if ((ulong)(*(long *)(this + 0x48) - lVar2 >> 2) <= uVar3) {
    local_38 = CONCAT44(local_38._4_4_,0xffffffff);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(this + 0x40),
               *(long *)(this + 0xf0) - *(long *)(this + 0xe8) >> 2,
               (value_type_conflict1 *)&local_38);
    lVar2 = *(long *)(this + 0x40);
  }
  *(undefined4 *)(lVar2 + uVar3 * 4) = *(undefined4 *)(this + 0x38);
  DVar1 = dim;
  if (dim == -1) {
    uVar3 = (long)(boundary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(boundary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                  _M_impl.super__Vector_impl_data._M_start;
    if (uVar3 == 0) {
      DVar1 = 0;
    }
    else {
      DVar1 = (int)(uVar3 >> 2) + -1;
    }
  }
  if ((*(int *)this == -1) || (*(int *)this < DVar1)) {
    *(Dimension *)this = DVar1;
  }
  _reduce_boundary<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            (__return_storage_ptr__,this,cellID,boundary,dim);
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<typename Master_matrix::Entry_representative> Chain_matrix<Master_matrix>::insert_boundary(
    ID_index cellID, const Boundary_range& boundary, Dimension dim)
{
  if constexpr (!Master_matrix::Option_list::has_map_column_container) {
    if (pivotToColumnIndex_.size() <= cellID) {
      pivotToColumnIndex_.resize(cellID * 2 + 1, Master_matrix::template get_null_value<Index>());
    }
  }

  if constexpr (Master_matrix::Option_list::has_vine_update && Master_matrix::Option_list::has_column_pairings) {
    if constexpr (Master_matrix::Option_list::has_map_column_container) {
      Swap_opt::CP::pivotToPosition_.try_emplace(cellID, _nextPosition());
    } else {
      if (Swap_opt::CP::pivotToPosition_.size() <= cellID)
        Swap_opt::CP::pivotToPosition_.resize(pivotToColumnIndex_.size(),
                                              Master_matrix::template get_null_value<Pos_index>());
      Swap_opt::CP::pivotToPosition_[cellID] = _nextPosition();
    }
  }

  if constexpr (Master_matrix::Option_list::has_matrix_maximal_dimension_access) {
    Dim_opt::update_up(dim == Master_matrix::template get_null_value<Dimension>()
                           ? (boundary.size() == 0 ? 0 : boundary.size() - 1)
                           : dim);
  }

  return _reduce_boundary(cellID, boundary, dim);
}